

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O2

void __thiscall
gui::DialogBox::setOptionButton(DialogBox *this,size_t index,shared_ptr<gui::Button> *button)

{
  pointer psVar1;
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  pointer psVar4;
  ulong uVar5;
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    psVar4 = (this->optionButtons_).
             super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (index < (ulong)((long)(this->optionButtons_).
                              super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4)) {
      std::__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Button,void>
                ((__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 &psVar4[index].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>);
      ContainerBase::removeChild((ContainerBase *)this,(shared_ptr<gui::Widget> *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      local_58._M_ptr = (element_type *)0x0;
      local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->optionButtons_).
                  super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[index].
                  super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>,&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      psVar1 = (this->optionButtons_).
               super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = psVar1 + index;
      uVar5 = index - 1;
      do {
        uVar5 = uVar5 + 1;
        if ((ulong)((long)(this->optionButtons_).
                          super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5)
        {
          std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
          ::resize(&this->optionButtons_,index);
          break;
        }
        p_Var2 = &psVar4->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>;
        psVar4 = psVar4 + 1;
      } while (p_Var2->_M_ptr == (element_type *)0x0);
    }
  }
  else {
    std::__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Button,void>
              ((__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               &button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>);
    bVar3 = ContainerBase::hasChild((ContainerBase *)this,(shared_ptr<gui::Widget> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    if (!bVar3) {
      std::__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Button,void>
                (local_40,&button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>);
      (*(this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[2])
                (this,local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    }
    psVar4 = (this->optionButtons_).
             super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->optionButtons_).
                      super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4) <= index) {
      std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
      resize(&this->optionButtons_,index + 1);
      psVar4 = (this->optionButtons_).
               super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar4[index].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>,
               &button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>);
  }
  updateButtons(this);
  return;
}

Assistant:

void DialogBox::setOptionButton(size_t index, std::shared_ptr<Button> button) {
    if (button != nullptr) {
        if (!hasChild(button)) {
            addChild(button);
        }
        if (index >= optionButtons_.size()) {
            optionButtons_.resize(index + 1);
        }
        optionButtons_[index] = button;
    } else if (index < optionButtons_.size()) {
        removeChild(optionButtons_[index]);
        optionButtons_[index] = nullptr;
        bool foundButton = false;
        for (size_t i = index; i < optionButtons_.size(); ++i) {
            if (optionButtons_[i] != nullptr) {
                foundButton = true;
                break;
            }
        }
        if (!foundButton) {
            optionButtons_.resize(index);
        }
    }
    updateButtons();
}